

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

void Saig_SynchInitRegsTernary(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  Vec_Ptr_t *p;
  int iVar1;
  void *pvVar2;
  int local_38;
  int local_34;
  int w;
  int i;
  uint *pSim;
  Aig_Obj_t *pObj;
  int nWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  for (local_34 = 0; iVar1 = Saig_ManRegNum(pAig), local_34 < iVar1; local_34 = local_34 + 1) {
    p = pAig->vCis;
    iVar1 = Saig_ManPiNum(pAig);
    pvVar2 = Vec_PtrEntry(p,local_34 + iVar1);
    pvVar2 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar2 + 0x24));
    for (local_38 = 0; local_38 < nWords; local_38 = local_38 + 1) {
      *(undefined4 *)((long)pvVar2 + (long)local_38 * 4) = 0xffffffff;
    }
  }
  return;
}

Assistant:

void Saig_SynchInitRegsTernary( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = 0xffffffff;
    }
}